

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.h
# Opt level: O3

bool operator<(CExtPubKey *a,CExtPubKey *b)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = operator<(&a->pubkey,&b->pubkey);
  bVar3 = true;
  if (!bVar2) {
    bVar2 = operator>(&a->pubkey,&b->pubkey);
    if (bVar2) {
      bVar3 = false;
    }
    else {
      iVar4 = memcmp(&a->chaincode,&b->chaincode,0x20);
      bVar3 = SUB41((uint)iVar4 >> 0x1f,0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool operator<(const CExtPubKey &a, const CExtPubKey &b)
    {
        if (a.pubkey < b.pubkey) {
            return true;
        } else if (a.pubkey > b.pubkey) {
            return false;
        }
        return a.chaincode < b.chaincode;
    }